

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-quest.c
# Opt level: O1

void cleanup_quest(void)

{
  quest_artifact *p;
  quest_place *p_00;
  quest *pqVar1;
  quest_artifact *pqVar2;
  quest_place *pqVar3;
  quest *p_01;
  
  p_01 = quests;
  if (quests != (quest *)0x0) {
    do {
      p = p_01->arts;
      p_00 = p_01->place;
      pqVar1 = p_01->next;
      string_free(p_01->name);
      while (p != (quest_artifact *)0x0) {
        pqVar2 = p->next;
        mem_free(p);
        p = pqVar2;
      }
      while (p_00 != (quest_place *)0x0) {
        pqVar3 = p_00->next;
        mem_free(p_00);
        p_00 = pqVar3;
      }
      mem_free(p_01);
      p_01 = pqVar1;
    } while (pqVar1 != (quest *)0x0);
  }
  return;
}

Assistant:

static void cleanup_quest(void)
{
	struct quest *quest = quests, *next;

	while (quest) {
		struct quest_artifact *arts = quest->arts, *next_art;
		struct quest_place *place = quest->place, *next_place;
		next = quest->next;
		string_free(quest->name);
		while (arts) {
			next_art = arts->next;
			mem_free(arts);
			arts = next_art;
		}
		while (place) {
			next_place = place->next;
			mem_free(place);
			place = next_place;
		}
		mem_free(quest);
		quest = next;
	}
}